

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

string * pstore::file::file_handle::get_temporary_directory_abi_cxx11_(void)

{
  char *pcVar1;
  allocator *paVar2;
  string *in_RDI;
  long lVar3;
  allocator local_1a;
  allocator local_19;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x20) {
      pcVar1 = "/tmp";
      paVar2 = &local_1a;
      goto LAB_0011d1de;
    }
    pcVar1 = getenv(*(char **)((long)get_temporary_directory::env_var_names._M_elems + lVar3));
    lVar3 = lVar3 + 8;
  } while (pcVar1 == (char *)0x0);
  paVar2 = &local_19;
LAB_0011d1de:
  std::__cxx11::string::string((string *)in_RDI,pcVar1,paVar2);
  return in_RDI;
}

Assistant:

std::string file_handle::get_temporary_directory () {
            // Following boost filesystem, we check some select environment variables
            // for user temporary directories before resorting to /tmp.
            static constexpr std::array<gsl::czstring, 4> env_var_names{{
                "TMPDIR",
                "TMP",
                "TEMP",
                "TEMPDIR",
            }};
            for (gsl::czstring const name : env_var_names) {
                if (gsl::czstring const val = std::getenv (name)) {
                    return val;
                }
            }
            return "/tmp";
        }